

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void ClipperLib::OffsetPolygons
               (Polygons *in_polys,Polygons *out_polys,double delta,JoinType jointype,
               double MiterLimit)

{
  PolyOffsetBuilder local_138;
  PolyOffsetBuilder local_b8;
  undefined1 local_48 [8];
  Polygons poly2;
  double MiterLimit_local;
  JoinType jointype_local;
  double delta_local;
  Polygons *out_polys_local;
  Polygons *in_polys_local;
  
  poly2.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)MiterLimit;
  if (out_polys == in_polys) {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              *)local_48,in_polys);
    PolyOffsetBuilder::PolyOffsetBuilder
              (&local_b8,
               (vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                *)local_48,out_polys,delta,jointype,
               (double)poly2.
                       super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    PolyOffsetBuilder::~PolyOffsetBuilder(&local_b8);
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               *)local_48);
  }
  else {
    PolyOffsetBuilder::PolyOffsetBuilder(&local_138,in_polys,out_polys,delta,jointype,MiterLimit);
    PolyOffsetBuilder::~PolyOffsetBuilder(&local_138);
  }
  return;
}

Assistant:

void OffsetPolygons(const Polygons &in_polys, Polygons &out_polys,
  double delta, JoinType jointype, double MiterLimit)
{
  if (&out_polys == &in_polys)
  {
    Polygons poly2(in_polys);
    PolyOffsetBuilder(poly2, out_polys, delta, jointype, MiterLimit);
  }
  else PolyOffsetBuilder(in_polys, out_polys, delta, jointype, MiterLimit);
}